

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_rawset(lua_State *L,int idx)

{
  uint64_t uVar1;
  TValue *pTVar2;
  GCtab *t_00;
  cTValue *key_00;
  TValue *pTVar3;
  TValue *key;
  TValue *dst;
  GCtab *t;
  int idx_local;
  lua_State *L_local;
  GCobj *o;
  
  pTVar2 = index2adr(L,idx);
  t_00 = (GCtab *)(pTVar2->u64 & 0x7fffffffffff);
  pTVar2 = L->top;
  key_00 = pTVar2 + -2;
  pTVar3 = lj_tab_set(L,t_00,key_00);
  *pTVar3 = pTVar2[-1];
  if ((t_00->marked & 4) != 0) {
    uVar1 = (L->glref).ptr64;
    t_00->marked = t_00->marked & 0xfb;
    (t_00->gclist).gcptr64 = *(uint64_t *)(uVar1 + 0x40);
    *(GCtab **)(uVar1 + 0x40) = t_00;
  }
  L->top = key_00;
  return;
}

Assistant:

LUA_API void lua_rawset(lua_State *L, int idx)
{
  GCtab *t = tabV(index2adr(L, idx));
  TValue *dst, *key;
  lj_checkapi_slot(2);
  key = L->top-2;
  dst = lj_tab_set(L, t, key);
  copyTV(L, dst, key+1);
  lj_gc_anybarriert(L, t);
  L->top = key;
}